

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void Init_ADPCMATable(void)

{
  int local_18;
  uint local_10;
  int value;
  int nib;
  int step;
  
  for (value = 0; value < 0x31; value = value + 1) {
    for (local_10 = 0; (int)local_10 < 0x10; local_10 = local_10 + 1) {
      local_18 = (int)(((local_10 & 7) * 2 + 1) * steps[value]) / 8;
      if ((local_10 & 8) != 0) {
        local_18 = -local_18;
      }
      jedi_table[(int)(value * 0x10 + local_10)] = local_18;
    }
  }
  return;
}

Assistant:

static void Init_ADPCMATable(void)
{
	int step, nib;

	for (step = 0; step < 49; step++)
	{
		/* loop over all nibbles and compute the difference */
		for (nib = 0; nib < 16; nib++)
		{
			int value = (2*(nib & 0x07) + 1) * steps[step] / 8;
			jedi_table[step*16 + nib] = (nib&0x08) ? -value : value;
		}
	}
}